

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void updateNormalHints(_GLFWwindow *window,int width,int height)

{
  int iVar1;
  int iVar2;
  XSizeHints *pXVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lStack_40;
  long supplied;
  
  pXVar3 = (*_glfw.x11.xlib.AllocSizeHints)();
  (*_glfw.x11.xlib.GetWMNormalHints)(_glfw.x11.display,(window->x11).handle,pXVar3,&supplied);
  uVar4 = pXVar3->flags & 0xffffffffffffff4f;
  pXVar3->flags = uVar4;
  if (window->monitor == (_GLFWmonitor *)0x0) {
    if (window->resizable == 0) {
      uVar4 = uVar4 | 0x30;
      lVar5 = 0x1c;
      lVar6 = 0x24;
      lVar7 = 0x18;
      lStack_40 = 0x20;
    }
    else {
      iVar1 = window->minwidth;
      if ((iVar1 != -1) && (iVar2 = window->minheight, iVar2 != -1)) {
        uVar4 = uVar4 | 0x10;
        pXVar3->flags = uVar4;
        pXVar3->min_width = iVar1;
        pXVar3->min_height = iVar2;
      }
      iVar1 = window->maxwidth;
      if ((iVar1 != -1) && (iVar2 = window->maxheight, iVar2 != -1)) {
        uVar4 = uVar4 | 0x20;
        pXVar3->flags = uVar4;
        pXVar3->max_width = iVar1;
        pXVar3->max_height = iVar2;
      }
      width = window->numer;
      if ((width == -1) || (height = window->denom, height == -1)) goto LAB_0011d27a;
      uVar4 = uVar4 | 0x80;
      lVar5 = 0x34;
      lVar6 = 0x3c;
      lVar7 = 0x30;
      lStack_40 = 0x38;
    }
    pXVar3->flags = uVar4;
    *(int *)((long)&pXVar3->flags + lStack_40) = width;
    *(int *)((long)&pXVar3->flags + lVar7) = width;
    *(int *)((long)&pXVar3->flags + lVar6) = height;
    *(int *)((long)&pXVar3->flags + lVar5) = height;
  }
LAB_0011d27a:
  (*_glfw.x11.xlib.SetWMNormalHints)(_glfw.x11.display,(window->x11).handle,pXVar3);
  (*_glfw.x11.xlib.Free)(pXVar3);
  return;
}

Assistant:

static void updateNormalHints(_GLFWwindow* window, int width, int height)
{
    XSizeHints* hints = XAllocSizeHints();

    long supplied;
    XGetWMNormalHints(_glfw.x11.display, window->x11.handle, hints, &supplied);

    hints->flags &= ~(PMinSize | PMaxSize | PAspect);

    if (!window->monitor)
    {
        if (window->resizable)
        {
            if (window->minwidth != GLFW_DONT_CARE &&
                window->minheight != GLFW_DONT_CARE)
            {
                hints->flags |= PMinSize;
                hints->min_width = window->minwidth;
                hints->min_height = window->minheight;
            }

            if (window->maxwidth != GLFW_DONT_CARE &&
                window->maxheight != GLFW_DONT_CARE)
            {
                hints->flags |= PMaxSize;
                hints->max_width = window->maxwidth;
                hints->max_height = window->maxheight;
            }

            if (window->numer != GLFW_DONT_CARE &&
                window->denom != GLFW_DONT_CARE)
            {
                hints->flags |= PAspect;
                hints->min_aspect.x = hints->max_aspect.x = window->numer;
                hints->min_aspect.y = hints->max_aspect.y = window->denom;
            }
        }
        else
        {
            hints->flags |= (PMinSize | PMaxSize);
            hints->min_width  = hints->max_width  = width;
            hints->min_height = hints->max_height = height;
        }
    }

    XSetWMNormalHints(_glfw.x11.display, window->x11.handle, hints);
    XFree(hints);
}